

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O0

void __thiscall
message_test_should_get_and_set_tags_Test::message_test_should_get_and_set_tags_Test
          (message_test_should_get_and_set_tags_Test *this)

{
  message_test_should_get_and_set_tags_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__message_test_should_get_and_set_tags_Test_00227c80;
  return;
}

Assistant:

TEST(message_test, should_get_and_set_tags)
{
    Fixpp::v42::Message::Logon logon;

    using namespace Fixpp;

    Fixpp::set<Tag::EncryptMethod>(logon, 1);
    ASSERT_EQ(Fixpp::get<Tag::EncryptMethod>(logon), 1);

    Fixpp::set<Tag::HeartBtInt>(logon, 30);
    ASSERT_EQ(Fixpp::get<Tag::HeartBtInt>(logon), 30);
}